

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpc_manager.cpp
# Opt level: O2

bool __thiscall miniros::RPCManager::start(RPCManager *this,int port)

{
  bool bVar1;
  ostream *poVar2;
  string *psVar3;
  socklen_t in_ECX;
  thread tStack_1d8;
  _Function_base local_1d0;
  code *local_1b8;
  RPCManager *local_1b0;
  stringstream ss;
  ostream local_198 [376];
  
  if ((this->server_thread_)._M_id._M_thread == 0) {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (start(int)::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"miniros.RPCManager",(allocator<char> *)&local_1d0);
      console::initializeLogLocation(&start(int)::loc,(string *)&ss,Info);
      std::__cxx11::string::~string((string *)&ss);
    }
    if (start(int)::loc.level_ != Info) {
      console::setLogLocationLevel(&start(int)::loc,Info);
      console::checkLogLocationEnabled(&start(int)::loc);
    }
    if (start(int)::loc.logger_enabled_ == true) {
      in_ECX = port;
      console::print((FilterBase *)0x0,start(int)::loc.logger_,start(int)::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                     ,0x83,"bool miniros::RPCManager::start(int)","Starting manager at port %d");
    }
    LOCK();
    (this->shutting_down_)._M_base._M_i = false;
    UNLOCK();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&ss,"getPid",(allocator<char> *)&tStack_1d8);
    local_1d0._M_functor._8_8_ = 0;
    local_1d0._M_functor._M_unused._M_function_pointer = getPid;
    local_1b8 = std::
                _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_void_(*)(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>
                ::_M_invoke;
    local_1d0._M_manager =
         std::
         _Function_handler<void_(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&),_void_(*)(const_XmlRpc::XmlRpcValue_&,_XmlRpc::XmlRpcValue_&)>
         ::_M_manager;
    bind(this,(int)&ss,(sockaddr *)&local_1d0,in_ECX);
    std::_Function_base::~_Function_base(&local_1d0);
    std::__cxx11::string::~string((string *)&ss);
    bVar1 = XmlRpc::XmlRpcServer::bindAndListen(&this->server_,port,5);
    if (bVar1) {
      this->port_ = (this->server_)._port;
      std::__cxx11::stringstream::stringstream((stringstream *)&ss);
      poVar2 = std::operator<<(local_198,"http://");
      psVar3 = network::getHost_abi_cxx11_();
      poVar2 = std::operator<<(poVar2,(string *)psVar3);
      poVar2 = std::operator<<(poVar2,":");
      poVar2 = (ostream *)std::ostream::operator<<((ostream *)poVar2,this->port_);
      std::operator<<(poVar2,"/");
      std::__cxx11::stringbuf::str();
      std::__cxx11::string::operator=((string *)this,(string *)&local_1d0);
      std::__cxx11::string::~string((string *)&local_1d0);
      local_1d0._M_functor._M_unused._M_function_pointer = serverThreadFunc;
      local_1d0._M_functor._8_8_ = 0;
      local_1b0 = this;
      std::thread::thread<void(miniros::RPCManager::*)(),miniros::RPCManager*,void>
                (&tStack_1d8,(type *)&local_1d0,&local_1b0);
      std::thread::operator=(&this->server_thread_,&tStack_1d8);
      std::thread::~thread(&tStack_1d8);
      std::__cxx11::stringstream::~stringstream((stringstream *)&ss);
      bVar1 = true;
    }
    else {
      bVar1 = false;
    }
  }
  else {
    if (console::g_initialized == '\0') {
      console::initialize();
    }
    if (start::loc.initialized_ == false) {
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&ss,"miniros.RPCManager",(allocator<char> *)&local_1d0);
      console::initializeLogLocation(&start::loc,(string *)&ss,Info);
      std::__cxx11::string::~string((string *)&ss);
    }
    if (start::loc.level_ != Info) {
      console::setLogLocationLevel(&start::loc,Info);
      console::checkLogLocationEnabled(&start::loc);
    }
    bVar1 = true;
    if (start::loc.logger_enabled_ == true) {
      console::print((FilterBase *)0x0,start::loc.logger_,start::loc.level_,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/dkargin[P]miniroscpp/src/transport/rpc_manager.cpp"
                     ,0x7f,"bool miniros::RPCManager::start(int)","Manager is running at port %d",
                     (ulong)(uint)this->port_);
    }
  }
  return bVar1;
}

Assistant:

bool RPCManager::start(int port)
{
  if (server_thread_.joinable()) {
    MINIROS_INFO("Manager is running at port %d", port_);
    return true;
  }

  MINIROS_INFO("Starting manager at port %d", port);
  shutting_down_ = false;
  bind("getPid", getPid);

  if (!server_.bindAndListen(port))
    return false;

  port_ = server_.get_port();
  MINIROS_ASSERT(port_ != 0);

  std::stringstream ss;
  ss << "http://" << network::getHost() << ":" << port_ << "/";
  uri_ = ss.str();

  server_thread_ = std::thread(&RPCManager::serverThreadFunc, this);
  return true;
}